

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_normal(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3,REF_DBL *normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_DBL edge2 [3];
  REF_DBL edge1 [3];
  REF_DBL *normal_local;
  REF_DBL *xyz3_local;
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  dVar1 = *xyz2;
  dVar2 = *xyz1;
  dVar3 = xyz2[1];
  dVar4 = xyz1[1];
  dVar5 = xyz2[2];
  dVar6 = xyz1[2];
  dVar7 = *xyz0;
  dVar8 = *xyz1;
  dVar9 = xyz0[1];
  dVar10 = xyz1[1];
  dVar11 = xyz0[2];
  dVar12 = xyz1[2];
  *normal = ((dVar3 - dVar4) * (dVar11 - dVar12) + -((dVar5 - dVar6) * (dVar9 - dVar10))) * 0.5 +
            *normal;
  normal[1] = ((dVar5 - dVar6) * (dVar7 - dVar8) + -((dVar1 - dVar2) * (dVar11 - dVar12))) * 0.5 +
              normal[1];
  normal[2] = ((dVar1 - dVar2) * (dVar9 - dVar10) + -((dVar3 - dVar4) * (dVar7 - dVar8))) * 0.5 +
              normal[2];
  dVar1 = *xyz0;
  dVar2 = *xyz3;
  dVar3 = xyz0[1];
  dVar4 = xyz3[1];
  dVar5 = xyz0[2];
  dVar6 = xyz3[2];
  dVar7 = *xyz2;
  dVar8 = *xyz3;
  dVar9 = xyz2[1];
  dVar10 = xyz3[1];
  dVar11 = xyz2[2];
  dVar12 = xyz3[2];
  *normal = ((dVar3 - dVar4) * (dVar11 - dVar12) + -((dVar5 - dVar6) * (dVar9 - dVar10))) * 0.5 +
            *normal;
  normal[1] = ((dVar5 - dVar6) * (dVar7 - dVar8) + -((dVar1 - dVar2) * (dVar11 - dVar12))) * 0.5 +
              normal[1];
  normal[2] = ((dVar1 - dVar2) * (dVar9 - dVar10) + -((dVar3 - dVar4) * (dVar7 - dVar8))) * 0.5 +
              normal[2];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_face_normal(REF_DBL *xyz0, REF_DBL *xyz1, REF_DBL *xyz2,
                                   REF_DBL *xyz3, REF_DBL *normal) {
  REF_DBL edge1[3], edge2[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;

  edge1[0] = xyz2[0] - xyz1[0];
  edge1[1] = xyz2[1] - xyz1[1];
  edge1[2] = xyz2[2] - xyz1[2];

  edge2[0] = xyz0[0] - xyz1[0];
  edge2[1] = xyz0[1] - xyz1[1];
  edge2[2] = xyz0[2] - xyz1[2];

  normal[0] += 0.5 * (edge1[1] * edge2[2] - edge1[2] * edge2[1]);
  normal[1] += 0.5 * (edge1[2] * edge2[0] - edge1[0] * edge2[2]);
  normal[2] += 0.5 * (edge1[0] * edge2[1] - edge1[1] * edge2[0]);

  edge1[0] = xyz0[0] - xyz3[0];
  edge1[1] = xyz0[1] - xyz3[1];
  edge1[2] = xyz0[2] - xyz3[2];

  edge2[0] = xyz2[0] - xyz3[0];
  edge2[1] = xyz2[1] - xyz3[1];
  edge2[2] = xyz2[2] - xyz3[2];

  normal[0] += 0.5 * (edge1[1] * edge2[2] - edge1[2] * edge2[1]);
  normal[1] += 0.5 * (edge1[2] * edge2[0] - edge1[0] * edge2[2]);
  normal[2] += 0.5 * (edge1[0] * edge2[1] - edge1[1] * edge2[0]);

  return REF_SUCCESS;
}